

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

CURLMcode singlesocket(Curl_multi *multi,Curl_easy *data)

{
  int *piVar1;
  uint uVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  Curl_hash *pCVar7;
  void *pvVar8;
  byte bVar9;
  long lVar10;
  size_t key_len;
  Curl_easy **key;
  ulong uVar11;
  easy_pollset cur_poll;
  int local_70;
  CURLMcode local_6c;
  Curl_easy *local_68;
  Curl_hash *local_60;
  int local_54;
  easy_pollset local_50;
  
  local_68 = data;
  multi_getsock(data,&local_50);
  if (local_50.num != 0) {
    local_60 = &multi->sockhash;
    uVar11 = 0;
    do {
      bVar9 = local_50.actions[uVar11];
      iVar5 = local_50.sockets[uVar11];
      local_70 = iVar5;
      if (iVar5 == -1) {
        pCVar7 = (Curl_hash *)0x0;
      }
      else {
        pCVar7 = (Curl_hash *)Curl_hash_pick(local_60,&local_70,4);
      }
      if (pCVar7 == (Curl_hash *)0x0) {
        local_54 = iVar5;
        if (iVar5 == -1) {
          pCVar7 = (Curl_hash *)0x0;
          local_70 = iVar5;
        }
        else {
          local_70 = iVar5;
          pCVar7 = (Curl_hash *)Curl_hash_pick(local_60,&local_70,4);
        }
        if (pCVar7 == (Curl_hash *)0x0) {
          pCVar7 = (Curl_hash *)(*Curl_ccalloc)(1,0x48);
          if (pCVar7 != (Curl_hash *)0x0) {
            Curl_hash_init(pCVar7,0xd,trhash,trhash_compare,trhash_dtor);
            pvVar8 = Curl_hash_add(local_60,&local_54,4,pCVar7);
            if (pvVar8 != (void *)0x0) goto LAB_00681ae9;
            Curl_hash_destroy(pCVar7);
            (*Curl_cfree)(pCVar7);
          }
          pCVar7 = (Curl_hash *)0x0;
        }
LAB_00681ae9:
        if (pCVar7 != (Curl_hash *)0x0) goto LAB_00681aee;
LAB_00681b3f:
        local_6c = CURLM_OUT_OF_MEMORY;
LAB_00681bee:
        bVar3 = true;
      }
      else {
        uVar2 = (local_68->last_poll).num;
        if (uVar2 != 0) {
          lVar10 = 0;
          do {
            if (iVar5 == (local_68->last_poll).sockets[lVar10]) {
              bVar4 = (local_68->last_poll).actions[lVar10];
              goto LAB_00681af0;
            }
            lVar10 = lVar10 + 1;
          } while (uVar2 != (uint)lVar10);
        }
LAB_00681aee:
        bVar4 = 0;
LAB_00681af0:
        if (bVar4 == 0) {
LAB_00681b03:
          piVar1 = (int *)((long)&pCVar7[1].table + 4);
          *piVar1 = *piVar1 + 1;
          if ((bVar9 & 1) != 0) {
            *(int *)&pCVar7[1].comp_func = *(int *)&pCVar7[1].comp_func + 1;
          }
          if ((bVar9 & 2) != 0) {
            piVar1 = (int *)((long)&pCVar7[1].comp_func + 4);
            *piVar1 = *piVar1 + 1;
          }
          pvVar8 = Curl_hash_add(pCVar7,&local_68,8,local_68);
          if (pvVar8 == (void *)0x0) {
            Curl_hash_destroy(pCVar7);
            goto LAB_00681b3f;
          }
        }
        else if (bVar4 == bVar9) {
          if (bVar4 == 0) goto LAB_00681b03;
        }
        else {
          if ((bVar4 & 1) != 0) {
            *(int *)&pCVar7[1].comp_func = *(int *)&pCVar7[1].comp_func + -1;
          }
          if ((bVar4 & 2) != 0) {
            piVar1 = (int *)((long)&pCVar7[1].comp_func + 4);
            *piVar1 = *piVar1 + -1;
          }
          if ((bVar9 & 1) != 0) {
            *(int *)&pCVar7[1].comp_func = *(int *)&pCVar7[1].comp_func + 1;
          }
          if ((bVar9 & 2) != 0) {
            piVar1 = (int *)((long)&pCVar7[1].comp_func + 4);
            *piVar1 = *piVar1 + 1;
          }
        }
        iVar6 = (uint)(*(int *)&pCVar7[1].comp_func != 0) +
                (uint)(*(int *)((long)&pCVar7[1].comp_func + 4) != 0) * 2;
        if ((bVar4 == 0) || (bVar3 = false, *(int *)&pCVar7[1].table != iVar6)) {
          if (multi->socket_cb != (curl_socket_callback)0x0) {
            multi->field_0x1b1 = multi->field_0x1b1 | 4;
            iVar5 = (*multi->socket_cb)(local_68,iVar5,iVar6,multi->socket_userp,pCVar7[1].hash_func
                                       );
            bVar9 = multi->field_0x1b1 & 0xfb;
            multi->field_0x1b1 = bVar9;
            if (iVar5 == -1) {
              multi->field_0x1b1 = bVar9 | 0x10;
              local_6c = CURLM_ABORTED_BY_CALLBACK;
              goto LAB_00681bee;
            }
          }
          *(int *)&pCVar7[1].table = iVar6;
          bVar3 = false;
        }
      }
      if (bVar3) {
        return local_6c;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < local_50.num);
  }
  if ((local_68->last_poll).num != 0) {
    uVar11 = 0;
    do {
      iVar5 = (local_68->last_poll).sockets[uVar11];
      if (local_50.num != 0) {
        lVar10 = 0;
        do {
          if (iVar5 == local_50.sockets[lVar10]) {
            iVar6 = 10;
            goto LAB_00681d21;
          }
          lVar10 = lVar10 + 1;
        } while (local_50.num != (uint)lVar10);
      }
      local_70 = iVar5;
      if (iVar5 == -1) {
        pCVar7 = (Curl_hash *)0x0;
      }
      else {
        pCVar7 = (Curl_hash *)Curl_hash_pick(&multi->sockhash,&local_70,4);
      }
      iVar6 = 0;
      if (pCVar7 != (Curl_hash *)0x0) {
        bVar9 = (local_68->last_poll).actions[uVar11];
        iVar6 = *(int *)((long)&pCVar7[1].table + 4) + -1;
        *(int *)((long)&pCVar7[1].table + 4) = iVar6;
        if ((bVar9 & 2) != 0) {
          piVar1 = (int *)((long)&pCVar7[1].comp_func + 4);
          *piVar1 = *piVar1 + -1;
        }
        if ((bVar9 & 1) != 0) {
          *(int *)&pCVar7[1].comp_func = *(int *)&pCVar7[1].comp_func + -1;
        }
        if (iVar6 == 0) {
          if (multi->socket_cb != (curl_socket_callback)0x0) {
            multi->field_0x1b1 = multi->field_0x1b1 | 4;
            iVar6 = (*multi->socket_cb)(local_68,iVar5,4,multi->socket_userp,pCVar7[1].hash_func);
            bVar9 = multi->field_0x1b1 & 0xfb;
            multi->field_0x1b1 = bVar9;
            if (iVar6 == -1) {
              multi->field_0x1b1 = bVar9 | 0x10;
              local_6c = CURLM_ABORTED_BY_CALLBACK;
              iVar6 = 1;
              goto LAB_00681d21;
            }
          }
          local_70 = iVar5;
          Curl_hash_destroy(pCVar7);
          key_len = 4;
          key = (Curl_easy **)&local_70;
          pCVar7 = &multi->sockhash;
        }
        else {
          key_len = 8;
          key = &local_68;
        }
        Curl_hash_delete(pCVar7,key,key_len);
        iVar6 = 0;
      }
LAB_00681d21:
      if ((iVar6 != 10) && (iVar6 != 0)) {
        return local_6c;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < (local_68->last_poll).num);
  }
  *(ulong *)((local_68->last_poll).sockets + 4) = CONCAT44(local_50.num,local_50.sockets[4]);
  (local_68->last_poll).actions[0] = local_50.actions[0];
  (local_68->last_poll).actions[1] = local_50.actions[1];
  (local_68->last_poll).actions[2] = local_50.actions[2];
  (local_68->last_poll).actions[3] = local_50.actions[3];
  (local_68->last_poll).actions[4] = local_50.actions[4];
  *(undefined3 *)&(local_68->last_poll).field_0x1d = local_50._29_3_;
  *(undefined8 *)(local_68->last_poll).sockets = local_50.sockets._0_8_;
  *(undefined8 *)((local_68->last_poll).sockets + 2) = local_50.sockets._8_8_;
  return CURLM_OK;
}

Assistant:

static CURLMcode singlesocket(struct Curl_multi *multi,
                              struct Curl_easy *data)
{
  struct easy_pollset cur_poll;
  unsigned int i;
  struct Curl_sh_entry *entry;
  curl_socket_t s;
  int rc;

  /* Fill in the 'current' struct with the state as it is now: what sockets to
     supervise and for what actions */
  multi_getsock(data, &cur_poll);

  /* We have 0 .. N sockets already and we get to know about the 0 .. M
     sockets we should have from now on. Detect the differences, remove no
     longer supervised ones and add new ones */

  /* walk over the sockets we got right now */
  for(i = 0; i < cur_poll.num; i++) {
    unsigned char cur_action = cur_poll.actions[i];
    unsigned char last_action = 0;
    int comboaction;

    s = cur_poll.sockets[i];

    /* get it from the hash */
    entry = sh_getentry(&multi->sockhash, s);
    if(entry) {
      /* check if new for this transfer */
      unsigned int j;
      for(j = 0; j< data->last_poll.num; j++) {
        if(s == data->last_poll.sockets[j]) {
          last_action = data->last_poll.actions[j];
          break;
        }
      }
    }
    else {
      /* this is a socket we didn't have before, add it to the hash! */
      entry = sh_addentry(&multi->sockhash, s);
      if(!entry)
        /* fatal */
        return CURLM_OUT_OF_MEMORY;
    }
    if(last_action && (last_action != cur_action)) {
      /* Socket was used already, but different action now */
      if(last_action & CURL_POLL_IN)
        entry->readers--;
      if(last_action & CURL_POLL_OUT)
        entry->writers--;
      if(cur_action & CURL_POLL_IN)
        entry->readers++;
      if(cur_action & CURL_POLL_OUT)
        entry->writers++;
    }
    else if(!last_action) {
      /* a new transfer using this socket */
      entry->users++;
      if(cur_action & CURL_POLL_IN)
        entry->readers++;
      if(cur_action & CURL_POLL_OUT)
        entry->writers++;

      /* add 'data' to the transfer hash on this socket! */
      if(!Curl_hash_add(&entry->transfers, (char *)&data, /* hash key */
                        sizeof(struct Curl_easy *), data)) {
        Curl_hash_destroy(&entry->transfers);
        return CURLM_OUT_OF_MEMORY;
      }
    }

    comboaction = (entry->writers ? CURL_POLL_OUT : 0) |
                   (entry->readers ? CURL_POLL_IN : 0);

    /* socket existed before and has the same action set as before */
    if(last_action && ((int)entry->action == comboaction))
      /* same, continue */
      continue;

    if(multi->socket_cb) {
      set_in_callback(multi, TRUE);
      rc = multi->socket_cb(data, s, comboaction, multi->socket_userp,
                            entry->socketp);

      set_in_callback(multi, FALSE);
      if(rc == -1) {
        multi->dead = TRUE;
        return CURLM_ABORTED_BY_CALLBACK;
      }
    }

    entry->action = comboaction; /* store the current action state */
  }

  /* Check for last_poll.sockets that no longer appear in cur_poll.sockets.
   * Need to remove the easy handle from the multi->sockhash->transfers and
   * remove multi->sockhash entry when this was the last transfer */
  for(i = 0; i< data->last_poll.num; i++) {
    unsigned int j;
    bool stillused = FALSE;
    s = data->last_poll.sockets[i];
    for(j = 0; j < cur_poll.num; j++) {
      if(s == cur_poll.sockets[j]) {
        /* this is still supervised */
        stillused = TRUE;
        break;
      }
    }
    if(stillused)
      continue;

    entry = sh_getentry(&multi->sockhash, s);
    /* if this is NULL here, the socket has been closed and notified so
       already by Curl_multi_closed() */
    if(entry) {
      unsigned char oldactions = data->last_poll.actions[i];
      /* this socket has been removed. Decrease user count */
      entry->users--;
      if(oldactions & CURL_POLL_OUT)
        entry->writers--;
      if(oldactions & CURL_POLL_IN)
        entry->readers--;
      if(!entry->users) {
        if(multi->socket_cb) {
          set_in_callback(multi, TRUE);
          rc = multi->socket_cb(data, s, CURL_POLL_REMOVE,
                                multi->socket_userp, entry->socketp);
          set_in_callback(multi, FALSE);
          if(rc == -1) {
            multi->dead = TRUE;
            return CURLM_ABORTED_BY_CALLBACK;
          }
        }
        sh_delentry(entry, &multi->sockhash, s);
      }
      else {
        /* still users, but remove this handle as a user of this socket */
        if(Curl_hash_delete(&entry->transfers, (char *)&data,
                            sizeof(struct Curl_easy *))) {
          DEBUGASSERT(NULL);
        }
      }
    }
  } /* for loop over num */

  /* Remember for next time */
  memcpy(&data->last_poll, &cur_poll, sizeof(data->last_poll));
  return CURLM_OK;
}